

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFUnit::DWARFUnit
          (DWARFUnit *this,DWARFContext *DC,DWARFSection *Section,DWARFUnitHeader *Header,
          DWARFDebugAbbrev *DA,DWARFSection *RS,DWARFSection *LocSection,StringRef SS,
          DWARFSection *SOS,DWARFSection *AOS,DWARFSection *LS,bool LE,bool IsDWO,
          DWARFUnitVector *UnitVector)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar5;
  size_t sVar6;
  undefined7 uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  undefined6 uVar10;
  FormParams FVar11;
  undefined4 uVar12;
  Entry *pEVar13;
  SectionContribution *pSVar14;
  StringRef SVar15;
  SectionContribution *C;
  Entry *IndexEntry;
  bool IsDWO_local;
  bool LE_local;
  DWARFSection *RS_local;
  DWARFDebugAbbrev *DA_local;
  DWARFUnitHeader *Header_local;
  DWARFSection *Section_local;
  DWARFContext *DC_local;
  DWARFUnit *this_local;
  
  this->_vptr_DWARFUnit = (_func_int **)&PTR__DWARFUnit_030a43e0;
  this->Context = DC;
  this->InfoSection = Section;
  uVar7 = *(undefined7 *)&(Header->DWOId).Storage.field_0x9;
  uVar8 = Header->UnitType;
  uVar9 = Header->Size;
  uVar10 = *(undefined6 *)&Header->field_0x4a;
  (this->Header).DWOId.Storage.hasVal = (Header->DWOId).Storage.hasVal;
  *(undefined7 *)&(this->Header).DWOId.Storage.field_0x9 = uVar7;
  (this->Header).UnitType = uVar8;
  (this->Header).Size = uVar9;
  *(undefined6 *)&(this->Header).field_0x4a = uVar10;
  uVar1 = Header->Offset;
  FVar11 = Header->FormParams;
  uVar12 = *(undefined4 *)&Header->field_0xc;
  uVar2 = Header->Length;
  uVar3 = Header->AbbrOffset;
  pEVar13 = Header->IndexEntry;
  uVar4 = Header->TypeHash;
  aVar5 = (Header->DWOId).Storage.field_0;
  (this->Header).TypeOffset = Header->TypeOffset;
  (this->Header).DWOId.Storage.field_0 = aVar5;
  (this->Header).IndexEntry = pEVar13;
  (this->Header).TypeHash = uVar4;
  (this->Header).Length = uVar2;
  (this->Header).AbbrOffset = uVar3;
  (this->Header).Offset = uVar1;
  (this->Header).FormParams = FVar11;
  *(undefined4 *)&(this->Header).field_0xc = uVar12;
  this->Abbrev = DA;
  this->RangeSection = RS;
  (this->field_7).LocSection = LocSection;
  this->LineSection = LS;
  (this->StringSection).Data = SS.Data;
  (this->StringSection).Length = SS.Length;
  this->StringOffsetSection = SOS;
  this->AddrOffsetSection = AOS;
  this->AddrOffsetSectionBase = 0;
  this->isLittleEndian = LE;
  this->IsDWO = IsDWO;
  this->UnitVector = UnitVector;
  Optional<llvm::StrOffsetsContributionDescriptor>::Optional(&this->StringOffsetsTableContribution);
  Optional<llvm::DWARFDebugRnglistTable>::Optional(&this->RngListTable);
  Optional<llvm::object::SectionedAddress>::Optional(&this->BaseAddr);
  std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::vector
            (&this->DieArray);
  std::
  map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
  ::map(&this->AddrDieMap);
  std::shared_ptr<llvm::DWARFUnit>::shared_ptr(&this->DWO);
  clear(this);
  if (IsDWO) {
    sVar6 = (LocSection->Data).Length;
    (this->field_7).LocSection = (DWARFSection *)(LocSection->Data).Data;
    (this->field_7).LocSectionData.Length = sVar6;
    pEVar13 = DWARFUnitHeader::getIndexEntry(Header);
    if ((pEVar13 != (Entry *)0x0) &&
       (pSVar14 = DWARFUnitIndex::Entry::getOffset(pEVar13,DW_SECT_LOC),
       pSVar14 != (SectionContribution *)0x0)) {
      SVar15 = StringRef::substr(&(this->field_7).LocSectionData,(ulong)pSVar14->Offset,
                                 (ulong)pSVar14->Length);
      (this->field_7).LocSectionData = SVar15;
    }
  }
  return;
}

Assistant:

DWARFUnit::DWARFUnit(DWARFContext &DC, const DWARFSection &Section,
                     const DWARFUnitHeader &Header, const DWARFDebugAbbrev *DA,
                     const DWARFSection *RS, const DWARFSection *LocSection,
                     StringRef SS, const DWARFSection &SOS,
                     const DWARFSection *AOS, const DWARFSection &LS, bool LE,
                     bool IsDWO, const DWARFUnitVector &UnitVector)
    : Context(DC), InfoSection(Section), Header(Header), Abbrev(DA),
      RangeSection(RS), LocSection(LocSection), LineSection(LS),
      StringSection(SS), StringOffsetSection(SOS), AddrOffsetSection(AOS),
      isLittleEndian(LE), IsDWO(IsDWO), UnitVector(UnitVector) {
  clear();
  // For split DWARF we only need to keep track of the location list section's
  // data (no relocations), and if we are reading a package file, we need to
  // adjust the location list data based on the index entries.
  if (IsDWO) {
    LocSectionData = LocSection->Data;
    if (auto *IndexEntry = Header.getIndexEntry())
      if (const auto *C = IndexEntry->getOffset(DW_SECT_LOC))
        LocSectionData = LocSectionData.substr(C->Offset, C->Length);
  }
}